

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_setup.cpp
# Opt level: O3

void P_LoadLineDefs2(MapData *map)

{
  double *pdVar1;
  double dVar2;
  ushort uVar3;
  ushort uVar4;
  FileReader *pFVar5;
  undefined1 auVar6 [16];
  DWORD DVar7;
  int iVar8;
  ulong __n;
  ushort *puVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  ushort *puVar13;
  line_t_conflict *ld;
  long lVar14;
  
  pFVar5 = map->MapLumps[2].Reader;
  if (pFVar5 == (FileReader *)0x0) {
    iVar11 = 0;
  }
  else {
    iVar11 = (int)pFVar5->Length;
  }
  uVar10 = iVar11 >> 4;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = (long)(int)uVar10;
  __n = SUB168(auVar6 * ZEXT816(0x98),0);
  uVar12 = 0xffffffffffffffff;
  if (SUB168(auVar6 * ZEXT816(0x98),8) == 0) {
    uVar12 = __n;
  }
  numlines = uVar10;
  lines = (line_t_conflict *)operator_new__(uVar12);
  if (linemap.Count <= uVar10 && uVar10 - linemap.Count != 0) {
    TArray<int,_int>::Grow(&linemap,uVar10 - linemap.Count);
    __n = (long)numlines * 0x98;
  }
  linemap.Count = uVar10;
  memset(lines,0,__n);
  puVar9 = (ushort *)operator_new__((long)iVar11);
  pFVar5 = map->MapLumps[2].Reader;
  lVar14 = pFVar5->Length;
  map->file = pFVar5;
  (*(pFVar5->super_FileReaderBase)._vptr_FileReaderBase[4])(pFVar5,0,0);
  (*(map->file->super_FileReaderBase)._vptr_FileReaderBase[2])(map->file,puVar9,(long)(int)lVar14);
  sidecount = 0;
  if (0 < numlines) {
    uVar10 = 0;
    iVar11 = 0;
    do {
      lVar14 = (long)(int)uVar10;
      puVar13 = puVar9 + lVar14 * 8;
      uVar3 = puVar9[lVar14 * 8];
      uVar4 = puVar9[lVar14 * 8 + 1];
      if (uVar3 == uVar4) {
LAB_0044811d:
        Printf("Removing 0-length line %d\n",(ulong)(uVar10 + iVar11));
        iVar8 = numlines;
        memmove(puVar13,puVar13 + 8,(long)(int)(~uVar10 + numlines) << 4);
        iVar11 = iVar11 + 1;
        numlines = iVar8 + -1;
      }
      else {
        dVar2 = vertexes[uVar3].p.X;
        if ((dVar2 == vertexes[uVar4].p.X) && (!NAN(dVar2) && !NAN(vertexes[uVar4].p.X))) {
          dVar2 = vertexes[uVar3].p.Y;
          pdVar1 = &vertexes[uVar4].p.Y;
          if ((dVar2 == *pdVar1) && (!NAN(dVar2) && !NAN(*pdVar1))) goto LAB_0044811d;
        }
        if (puVar13[6] == 0xffff) {
          Printf("Line %d has no first side.\n",(ulong)uVar10);
          puVar13[6] = 0;
        }
        iVar8 = sidecount + 1;
        if (puVar13[7] != 0xffff) {
          iVar8 = sidecount + 2;
        }
        sidecount = iVar8;
        linemap.Array[lVar14] = uVar10 + iVar11;
        uVar10 = uVar10 + 1;
      }
    } while ((int)uVar10 < numlines);
    if (0 < iVar11) {
      ForceNodeBuild = true;
    }
  }
  P_AllocateSideDefs(sidecount);
  if (0 < numlines) {
    iVar11 = 0;
    puVar13 = puVar9;
    ld = lines;
    do {
      ld->portalindex = 0xffffffff;
      lVar14 = 0xb;
      do {
        ld->args[lVar14 + -0xb] = (uint)*(byte *)((long)puVar13 + lVar14 + -4);
        lVar14 = lVar14 + 1;
      } while (lVar14 != 0x10);
      ld->flags = (uint)puVar13[2];
      ld->special = (uint)(byte)puVar13[3];
      ld->v1 = vertexes + *puVar13;
      ld->v2 = vertexes + puVar13[1];
      ld->alpha = 1.0;
      P_SetSideNum(ld->sidedef,puVar13[6]);
      P_SetSideNum(ld->sidedef + 1,puVar13[7]);
      P_AdjustLine(ld);
      P_SetLineID(iVar11,ld);
      P_SaveLineSpecial(ld);
      DVar7 = level.flags2;
      uVar10 = ld->flags >> 10 & 7;
      ld->activation = 1 << (sbyte)uVar10;
      if ((uVar10 | 4) == 7) {
        ld->activation = 0x28;
      }
      uVar10 = DVar7 << 10;
      ld->flags = ld->flags & 0xffffe3ff | uVar10 & 0x80000 |
                  (DVar7 & 0x800) << 0xb | uVar10 & 0x100000;
      iVar11 = iVar11 + 1;
      puVar13 = puVar13 + 8;
      ld = ld + 1;
    } while (iVar11 < numlines);
  }
  operator_delete__(puVar9);
  return;
}

Assistant:

void P_LoadLineDefs2 (MapData * map)
{
	int i, skipped;
	line_t *ld;
	int lumplen = map->Size(ML_LINEDEFS);
	char * mldf;
	maplinedef2_t *mld;
		
	numlines = lumplen / sizeof(maplinedef2_t);
	lines = new line_t[numlines];
	linemap.Resize(numlines);
	memset (lines, 0, numlines*sizeof(line_t));

	mldf = new char[lumplen];
	map->Read(ML_LINEDEFS, mldf);

	// [RH] Remove any lines that have 0 length and count sidedefs used
	for (skipped = sidecount = i = 0; i < numlines; )
	{
		mld = ((maplinedef2_t*)mldf) + i;

		if (mld->v1 == mld->v2 ||
			(vertexes[LittleShort(mld->v1)].fX() == vertexes[LittleShort(mld->v2)].fX() &&
			 vertexes[LittleShort(mld->v1)].fY() == vertexes[LittleShort(mld->v2)].fY()))
		{
			Printf ("Removing 0-length line %d\n", i+skipped);
			memmove (mld, mld+1, sizeof(*mld)*(numlines-i-1));
			skipped++;
			numlines--;
		}
		else
		{
			// patch missing first sides instead of crashing out.
			// Visual glitches are better than not being able to play.
			if (LittleShort(mld->sidenum[0]) == NO_INDEX)
			{
				Printf("Line %d has no first side.\n", i);
				mld->sidenum[0] = 0;
			}
			sidecount++;
			if (LittleShort(mld->sidenum[1]) != NO_INDEX)
				sidecount++;
			linemap[i] = i+skipped;
			i++;
		}
	}
	if (skipped > 0)
	{
		ForceNodeBuild = true;
	}

	P_AllocateSideDefs (sidecount);

	mld = (maplinedef2_t *)mldf;
	ld = lines;
	for (i = 0; i < numlines; i++, mld++, ld++)
	{
		int j;

		ld->portalindex = UINT_MAX;

		for (j = 0; j < 5; j++)
			ld->args[j] = mld->args[j];

		ld->flags = LittleShort(mld->flags);
		ld->special = mld->special;

		ld->v1 = &vertexes[LittleShort(mld->v1)];
		ld->v2 = &vertexes[LittleShort(mld->v2)];
		ld->alpha = 1.;	// [RH] Opaque by default

		P_SetSideNum (&ld->sidedef[0], LittleShort(mld->sidenum[0]));
		P_SetSideNum (&ld->sidedef[1], LittleShort(mld->sidenum[1]));

		P_AdjustLine (ld);
		P_SetLineID(i, ld);
		P_SaveLineSpecial (ld);
		if (level.flags2 & LEVEL2_CLIPMIDTEX) ld->flags |= ML_CLIP_MIDTEX;
		if (level.flags2 & LEVEL2_WRAPMIDTEX) ld->flags |= ML_WRAP_MIDTEX;
		if (level.flags2 & LEVEL2_CHECKSWITCHRANGE) ld->flags |= ML_CHECKSWITCHRANGE;

		// convert the activation type
		ld->activation = 1 << GET_SPAC(ld->flags);
		if (ld->activation == SPAC_AnyCross)
		{ // this is really PTouch
			ld->activation = SPAC_Impact | SPAC_PCross;
		}
		else if (ld->activation == SPAC_Impact)
		{ // In non-UMDF maps, Impact implies PCross
			ld->activation = SPAC_Impact | SPAC_PCross;
		}
		ld->flags &= ~ML_SPAC_MASK;
	}
	delete[] mldf;
}